

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t cmp_key_mbs(archive_rb_node *n,void *key)

{
  archive *in_RSI;
  archive_mstring *in_RDI;
  char *p;
  match_file *f;
  char **in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  archive_mstring_get_mbs(in_RSI,in_RDI,in_stack_ffffffffffffffd8);
  if (in_stack_ffffffffffffffd8 == (char **)0x0) {
    local_4 = L'\xffffffff';
  }
  else {
    local_4 = strcmp((char *)in_stack_ffffffffffffffd8,(char *)in_RSI);
  }
  return local_4;
}

Assistant:

static int
cmp_key_mbs(const struct archive_rb_node *n, const void *key)
{
	struct match_file *f = (struct match_file *)(uintptr_t)n;
	const char *p;

	archive_mstring_get_mbs(NULL, &(f->pathname), &p);
	if (p == NULL)
		return (-1);
	return (strcmp(p, (const char *)key));
}